

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.cpp
# Opt level: O1

void polyscope::screenshot(bool transparentBG)

{
  bool bVar1;
  size_t sVar2;
  string defaultName;
  char buff [50];
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  string local_c8;
  string local_a8;
  string local_88;
  char local_68 [56];
  
  snprintf(local_68,0x32,"screenshot_%06zu%s",state::screenshotInd,
           options::screenshotExtension_abi_cxx11_);
  local_e8 = local_d8;
  sVar2 = strlen(local_68);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,local_68,local_68 + sVar2);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,options::screenshotExtension_abi_cxx11_,
             DAT_004bdc88 + options::screenshotExtension_abi_cxx11_);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,".png","");
  bVar1 = anon_unknown_3::hasExtension(&local_88,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_e8,local_e8 + local_e0);
  screenshot(&local_c8,bVar1 && transparentBG);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  state::screenshotInd = state::screenshotInd + 1;
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  return;
}

Assistant:

void screenshot(bool transparentBG) {

  char buff[50];
  snprintf(buff, 50, "screenshot_%06zu%s", state::screenshotInd, options::screenshotExtension.c_str());
  std::string defaultName(buff);

  // only pngs can be written with transparency
  if (!hasExtension(options::screenshotExtension, ".png")) {
    transparentBG = false;
  }

  screenshot(defaultName, transparentBG);

  state::screenshotInd++;
}